

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

string * Iterator(string *__return_storage_ptr__,string *FileName)

{
  undefined8 uVar1;
  ifstream ResultReader;
  long local_218 [29];
  undefined8 auStack_130 [36];
  
  std::ifstream::ifstream(local_218,(string *)FileName,_S_in);
  uVar1 = *(undefined8 *)((long)auStack_130 + *(long *)(local_218[0] + -0x18));
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((string *)__return_storage_ptr__,uVar1,0xffffffff,0,0xffffffff);
  std::ifstream::~ifstream(local_218);
  return __return_storage_ptr__;
}

Assistant:

std::string Iterator(std::string FileName)
{
    std::ifstream ResultReader(FileName);
    std::string Results((std::istreambuf_iterator<char>(ResultReader)),
                         std::istreambuf_iterator<char>());
    return Results;
}